

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeAtomicLoad
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,uint bytes,Address offset,
          Type type,Name mem)

{
  __index_type *this_00;
  Load *expr;
  bool bVar1;
  Ok local_101;
  size_t local_100;
  char *local_f8;
  uintptr_t local_f0;
  address64_t local_e8;
  uint local_dc;
  Err local_d8;
  Err *local_a8;
  Err *err;
  Result<wasm::Ok> _val;
  Load curr;
  uint bytes_local;
  IRBuilder *this_local;
  Type type_local;
  Address offset_local;
  
  this_00 = &_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index;
  curr.memory.super_IString.str._M_str._4_4_ = bytes;
  Load::Load((Load *)this_00);
  wasm::Name::operator=((Name *)&curr.ptr,&mem);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitLoad
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,
             (Load *)this_00);
  local_a8 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar1 = local_a8 != (Err *)0x0;
  if (bVar1) {
    wasm::Err::Err(&local_d8,local_a8);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_d8);
    wasm::Err::~Err(&local_d8);
  }
  local_dc = (uint)bVar1;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_dc == 0) {
    local_100 = mem.super_IString.str._M_len;
    local_f8 = mem.super_IString.str._M_str;
    local_f0 = type.id;
    local_e8 = offset.addr;
    expr = Builder::makeAtomicLoad
                     (&this->builder,curr.memory.super_IString.str._M_str._4_4_,offset,
                      (Expression *)curr._40_8_,type,mem);
    push(this,(Expression *)expr);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_101);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<>
IRBuilder::makeAtomicLoad(unsigned bytes, Address offset, Type type, Name mem) {
  Load curr;
  curr.memory = mem;
  CHECK_ERR(visitLoad(&curr));
  push(builder.makeAtomicLoad(bytes, offset, curr.ptr, type, mem));
  return Ok{};
}